

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# FilePOSIX.cpp
# Opt level: O2

void __thiscall adios2::transport::FilePOSIX::SeekToEnd(FilePOSIX *this)

{
  int *piVar1;
  __off_t _Var2;
  allocator local_eb;
  allocator local_ea;
  allocator local_e9;
  string local_e8;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_c8;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_a8;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_88;
  string local_68;
  string local_48;
  string local_28;
  
  WaitForOpen(this);
  piVar1 = __errno_location();
  *piVar1 = 0;
  _Var2 = lseek(this->m_FileDescriptor,0,2);
  this->m_Errno = 0;
  if ((int)_Var2 == -1) {
    std::__cxx11::string::string((string *)&local_28,"Toolkit",&local_e9);
    std::__cxx11::string::string((string *)&local_48,"transport::file::FilePOSIX",&local_ea);
    std::__cxx11::string::string((string *)&local_68,"SeekToEnd",&local_eb);
    std::operator+(&local_c8,"couldn\'t seek to the end of file ",&(this->super_Transport).m_Name);
    std::operator+(&local_a8,&local_c8," ");
    SysErrMsg_abi_cxx11_(&local_e8,this);
    std::operator+(&local_88,&local_a8,&local_e8);
    helper::Throw<std::ios_base::failure[abi:cxx11]>(&local_28,&local_48,&local_68,&local_88,-1);
    std::__cxx11::string::~string((string *)&local_88);
    std::__cxx11::string::~string((string *)&local_e8);
    std::__cxx11::string::~string((string *)&local_a8);
    std::__cxx11::string::~string((string *)&local_c8);
    std::__cxx11::string::~string((string *)&local_68);
    std::__cxx11::string::~string((string *)&local_48);
    std::__cxx11::string::~string((string *)&local_28);
  }
  return;
}

Assistant:

void FilePOSIX::SeekToEnd()
{
    WaitForOpen();
    errno = 0;
    const int status = lseek(m_FileDescriptor, 0, SEEK_END);
    m_Errno = 0;
    if (status == -1)
    {
        helper::Throw<std::ios_base::failure>("Toolkit", "transport::file::FilePOSIX", "SeekToEnd",
                                              "couldn't seek to the end of file " + m_Name + " " +
                                                  SysErrMsg());
    }
}